

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

int ON_Font::CompareWeight(Weight weight_a,Weight weight_b)

{
  return -(uint)(weight_a < weight_b);
}

Assistant:

int ON_Font::CompareWeight(
  ON_Font::Weight weight_a,
  ON_Font::Weight weight_b
  )
{
  unsigned int a = static_cast<unsigned int>(weight_a);
  unsigned int b = static_cast<unsigned int>(weight_b);
  if ( a < b )
    return -1;
  if ( a < b )
    return 1;
  return 0;
}